

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_init_xtc(float p,float t,size_t min_keep,uint32_t seed)

{
  uint32_t uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  llama_sampler *plVar2;
  undefined4 in_ESI;
  unsigned_long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  uint32_t seed_cur;
  uint32_t in_stack_00002700;
  llama_sampler_context_t in_stack_ffffffffffffffc8;
  
  uVar1 = get_rng_seed(in_stack_00002700);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(0x13a0);
  *(undefined4 *)this->_M_x = in_XMM0_Da;
  *(undefined4 *)((long)this->_M_x + 4) = in_XMM1_Da;
  this->_M_x[1] = in_RDI;
  *(undefined4 *)(this->_M_x + 2) = in_ESI;
  *(uint32_t *)((long)this->_M_x + 0x14) = uVar1;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,(result_type)in_stack_ffffffffffffffc8);
  plVar2 = llama_sampler_init((llama_sampler_i *)this,in_stack_ffffffffffffffc8);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_xtc(float p, float t, size_t min_keep, uint32_t seed) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_xtc_i,
        /* .ctx   = */ new llama_sampler_xtc {
            /* .probability   = */ p,
            /* .threshold     = */ t,
            /* .min_keep      = */ min_keep,
            /* .seed          = */ seed,
            /* .seed_cur      = */ seed_cur,
            /* .rng           = */ std::mt19937(seed_cur),
        }
    );
}